

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t id)

{
  uint32_t *ts;
  uint uVar1;
  uint uVar2;
  char (*ts_1) [2];
  bool bVar3;
  uint32_t uVar4;
  BaseType BVar5;
  size_type sVar6;
  SPIRType *pSVar7;
  SPIRConstant *pSVar8;
  SPIRType *pSVar9;
  CompilerError *pCVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1_00;
  uint *ts_1_01;
  uint uVar11;
  char *pcVar13;
  char (*in_R8) [2];
  uint *in_R9;
  uint32_t *ts_00;
  string scope_expr;
  char *local_a8;
  uint32_t id_local;
  string local_98;
  SPIRType *local_78;
  string local_70;
  string local_50;
  ulong uVar12;
  
  id_local = id;
  bVar3 = Compiler::is_physical_pointer(&this->super_Compiler,type);
  if ((bVar3) &&
     (bVar3 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,type), !bVar3)) {
    pSVar7 = Compiler::get_pointee_type(&this->super_Compiler,type);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,pSVar7,0);
    local_78 = type;
    uVar4 = Compiler::get_decoration(&this->super_Compiler,(ID)(type->parent_type).id,ArrayStride);
    while (bVar3 = Compiler::is_array(&this->super_Compiler,pSVar7), bVar3) {
      if ((pSVar7->array_size_literal).super_VectorView<bool>.ptr
          [(pSVar7->array_size_literal).super_VectorView<bool>.buffer_size - 1] == true) {
        ts_1 = (char (*) [2])(local_78->array).super_VectorView<unsigned_int>.buffer_size;
        join<unsigned_int_const&,char_const(&)[2]>
                  (&scope_expr,
                   (spirv_cross *)
                   ((local_78->array).super_VectorView<unsigned_int>.ptr + (long)(ts_1[-1] + 1)),
                   (uint *)0x330c68,ts_1);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                  (&scope_expr,(spirv_cross *)0x30d430,
                   (char (*) [3])
                   ((local_78->array).super_VectorView<unsigned_int>.ptr +
                   ((local_78->array).super_VectorView<unsigned_int>.buffer_size - 1)),
                   (uint *)0x330c68,in_R8);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::~string((string *)&scope_expr);
      ::std::__cxx11::to_string(&local_98,uVar4);
      ::std::operator+(&scope_expr,"stride_",&local_98);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&scope_expr);
      ::std::__cxx11::string::~string((string *)&local_98);
      uVar4 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(pSVar7->parent_type).id,ArrayStride);
      pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(pSVar7->parent_type).id);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  BVar5 = type->basetype;
  switch(BVar5) {
  case Void:
    pcVar13 = "void";
    break;
  default:
switchD_002b0d2e_caseD_2:
    pSVar7 = type;
    if (BVar5 == AtomicCounter) {
      bVar3 = (this->options).es;
      uVar1 = (this->options).version;
      if ((uVar1 < 0x136 & bVar3) == 1) {
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar10,"At least ESSL 3.10 required for atomic counters.");
        goto LAB_002b1586;
      }
      if (bVar3 == false && uVar1 < 0x1a4) {
        ::std::__cxx11::string::string
                  ((string *)&scope_expr,"GL_ARB_shader_atomic_counters",(allocator *)&local_98);
        require_extension_internal(this,&scope_expr);
        ::std::__cxx11::string::~string((string *)&scope_expr);
      }
    }
    while ((bVar3 = Compiler::is_pointer(&this->super_Compiler,pSVar7), bVar3 ||
           (bVar3 = Compiler::is_array(&this->super_Compiler,pSVar7), bVar3))) {
      pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(pSVar7->parent_type).id);
    }
    if (*(int *)&(pSVar7->super_IVariant).field_0xc == 0x1168) {
      ::std::__cxx11::string::string
                ((string *)&scope_expr,"GL_KHR_cooperative_matrix",(allocator *)&local_98);
      require_extension_internal(this,&scope_expr);
      ::std::__cxx11::string::~string((string *)&scope_expr);
      if ((this->options).vulkan_semantics == false) {
        pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar10,"Cooperative matrix only available in Vulkan.");
LAB_002b1586:
        __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar8 = Compiler::get<spirv_cross::SPIRConstant>
                         (&this->super_Compiler,(pSVar7->cooperative).use_id);
      uVar4 = (pSVar8->m).c[0].r[0].u32;
      if (uVar4 == 2) {
        local_a8 = "gl_MatrixUseAccumulator";
      }
      else if (uVar4 == 1) {
        local_a8 = "gl_MatrixUseB";
      }
      else {
        if (uVar4 != 0) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar10,"Invalid matrix use.");
          goto LAB_002b1586;
        }
        local_a8 = "gl_MatrixUseA";
      }
      scope_expr._M_dataplus._M_p = (pointer)&scope_expr.field_2;
      scope_expr._M_string_length = 0;
      scope_expr.field_2._M_local_buf[0] = '\0';
      pSVar8 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                         (&this->super_Compiler,(pSVar7->cooperative).scope_id);
      if ((pSVar8 != (SPIRConstant *)0x0) && (pSVar8->specialization == false)) {
        ::std::__cxx11::string::string
                  ((string *)&local_98,"GL_KHR_memory_scope_semantics",(allocator *)&local_70);
        require_extension_internal(this,&local_98);
        ::std::__cxx11::string::~string((string *)&local_98);
        uVar4 = (pSVar8->m).c[0].r[0].u32;
        if ((uVar4 != 2) && (uVar4 != 3)) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar10,"Invalid scope for cooperative matrix.");
          __cxa_throw(pCVar10,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::assign((char *)&scope_expr);
      }
      if (scope_expr._M_string_length == 0) {
        to_expression_abi_cxx11_(&local_98,this,(pSVar7->cooperative).scope_id,true);
        ::std::__cxx11::string::operator=((string *)&scope_expr,(string *)&local_98);
        ::std::__cxx11::string::~string((string *)&local_98);
      }
      pSVar9 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(pSVar7->parent_type).id);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_98,this,pSVar9,0);
      to_expression_abi_cxx11_(&local_70,this,(pSVar7->cooperative).rows_id,true);
      to_expression_abi_cxx11_(&local_50,this,(pSVar7->cooperative).columns_id,true);
      join<char_const(&)[9],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],char_const*&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)"coopmat<",(char (*) [9])&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x341bb2,
                 (char (*) [3])&scope_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x341bb2,
                 (char (*) [3])&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x341bb2,
                 (char (*) [3])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x341bb2,
                 (char (*) [3])&local_a8,(char **)0x342c7f,(char (*) [2])scope_expr._M_dataplus._M_p
                );
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_98);
LAB_002b130f:
      ::std::__cxx11::string::~string((string *)&scope_expr);
      return __return_storage_ptr__;
    }
    uVar1 = type->vecsize;
    uVar2 = type->columns;
    if (uVar2 == 1 && uVar1 == 1) {
      switch(type->basetype) {
      case Boolean:
        pcVar13 = "bool";
        break;
      case SByte:
        pcVar13 = (this->backend).basic_int8_type;
        break;
      case UByte:
        pcVar13 = (this->backend).basic_uint8_type;
        break;
      case Short:
        pcVar13 = (this->backend).basic_int16_type;
        break;
      case UShort:
        pcVar13 = (this->backend).basic_uint16_type;
        break;
      case Int:
        goto switchD_002b10f2_caseD_7;
      case UInt:
        pcVar13 = (this->backend).basic_uint_type;
        break;
      case Int64:
        pcVar13 = "int64_t";
        break;
      case UInt64:
        pcVar13 = "uint64_t";
        break;
      case AtomicCounter:
        pcVar13 = "atomic_uint";
        break;
      case Half:
        pcVar13 = "float16_t";
        break;
      case Float:
        pcVar13 = "float";
        break;
      case Double:
        pcVar13 = "double";
        break;
      default:
        goto switchD_002b10f2_default;
      }
      break;
    }
    ts = &type->vecsize;
    if (uVar1 < 2 || uVar2 != 1) {
      uVar11 = type->basetype - Boolean;
      uVar12 = (ulong)uVar11;
      if (uVar1 == uVar2) {
        if (uVar11 < 0xd) {
          ts_1_01 = (uint *)((long)&switchD_002b1206::switchdataD_0034705c +
                            (long)(int)(&switchD_002b1206::switchdataD_0034705c)[uVar12]);
          switch(uVar12) {
          case 0:
            pcVar13 = "bmat";
            break;
          default:
            goto switchD_002b1206_caseD_1;
          case 5:
            pcVar13 = "imat";
            break;
          case 6:
            pcVar13 = "umat";
            break;
          case 10:
            pcVar13 = "f16mat";
            goto LAB_002b14d1;
          case 0xb:
            pcVar13 = "f16mat";
            goto LAB_002b1506;
          case 0xc:
            pcVar13 = "dmat";
          }
          goto LAB_002b149c;
        }
switchD_002b1206_caseD_1:
      }
      else if (uVar11 < 0xd) {
        ts_00 = &type->columns;
        switch(uVar12) {
        case 0:
          pcVar13 = "bmat";
          break;
        default:
          goto switchD_002b10f2_default;
        case 5:
          pcVar13 = "imat";
          break;
        case 6:
          pcVar13 = "umat";
          break;
        case 10:
          join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"f16mat",(char (*) [7])ts_00,
                     (uint *)0x344fd9,(char (*) [2])ts,in_R9);
          return __return_storage_ptr__;
        case 0xb:
          join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)0x351095,(char (*) [4])ts_00,
                     (uint *)0x344fd9,(char (*) [2])ts,in_R9);
          return __return_storage_ptr__;
        case 0xc:
          pcVar13 = "dmat";
        }
        join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                  (__return_storage_ptr__,(spirv_cross *)pcVar13,(char (*) [5])ts_00,
                   (uint *)0x344fd9,(char (*) [2])ts,in_R9);
        return __return_storage_ptr__;
      }
switchD_002b10f2_default:
      pcVar13 = "???";
      break;
    }
    ts_1_01 = &switchD_002b113c::switchdataD_00347090;
    switch(type->basetype) {
    case Boolean:
      pcVar13 = "bvec";
      goto LAB_002b149c;
    case SByte:
      pcVar13 = "i8vec";
      goto LAB_002b1412;
    case UByte:
      pcVar13 = "u8vec";
LAB_002b1412:
      join<char_const(&)[6],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar13,(char (*) [6])ts,
                 &switchD_002b113c::switchdataD_00347090);
      return __return_storage_ptr__;
    case Short:
      pcVar13 = "i16vec";
      break;
    case UShort:
      pcVar13 = "u16vec";
      break;
    case Int:
      pcVar13 = "ivec";
      goto LAB_002b149c;
    case UInt:
      pcVar13 = "uvec";
      goto LAB_002b149c;
    case Int64:
      pcVar13 = "i64vec";
      break;
    case UInt64:
      pcVar13 = "u64vec";
      break;
    default:
      goto switchD_002b10f2_default;
    case Half:
      pcVar13 = "f16vec";
      break;
    case Float:
      pcVar13 = "i64vec";
LAB_002b1506:
      join<char_const(&)[4],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)(pcVar13 + 3),(char (*) [4])ts,ts_1_01);
      return __return_storage_ptr__;
    case Double:
      pcVar13 = "dvec";
LAB_002b149c:
      join<char_const(&)[5],unsigned_int_const&>
                (__return_storage_ptr__,(spirv_cross *)pcVar13,(char (*) [5])ts,ts_1_01);
      return __return_storage_ptr__;
    }
LAB_002b14d1:
    join<char_const(&)[7],unsigned_int_const&>
              (__return_storage_ptr__,(spirv_cross *)pcVar13,(char (*) [7])ts,ts_1_01);
    return __return_storage_ptr__;
  case UInt:
    bVar3 = is_legacy(this);
    if (!bVar3) {
LAB_002b0faa:
      BVar5 = type->basetype;
      goto switchD_002b0d2e_caseD_2;
    }
    if ((this->options).es != true) {
      ::std::__cxx11::string::string
                ((string *)&scope_expr,"GL_EXT_gpu_shader4",(allocator *)&local_98);
      require_extension_internal(this,&scope_expr);
      ::std::__cxx11::string::~string((string *)&scope_expr);
      goto LAB_002b0faa;
    }
switchD_002b10f2_caseD_7:
    pcVar13 = (this->backend).basic_int_type;
    break;
  case Struct:
    if ((this->backend).explicit_struct_type != true) {
      (*(this->super_Compiler)._vptr_Compiler[6])
                (__return_storage_ptr__,this,(ulong)(type->super_IVariant).self.id,1);
      return __return_storage_ptr__;
    }
    ts_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (&scope_expr,this,(ulong)(type->super_IVariant).self.id);
    join<char_const(&)[8],std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)0x3042b2,(char (*) [8])&scope_expr,ts_1_00);
    goto LAB_002b130f;
  case Image:
  case SampledImage:
    (*(this->super_Compiler)._vptr_Compiler[0x17])(__return_storage_ptr__,this,type,(ulong)id,0);
    return __return_storage_ptr__;
  case Sampler:
    sVar6 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).comparison_ids._M_h,&id_local);
    pcVar13 = "samplerShadow";
    if (sVar6 == 0) {
      pcVar13 = "sampler";
    }
    break;
  case AccelerationStructure:
    pcVar13 = "accelerationStructureNV";
    if (this->ray_tracing_is_khr != false) {
      pcVar13 = "accelerationStructureEXT";
    }
    break;
  case RayQuery:
    pcVar13 = "rayQueryEXT";
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar13,(allocator *)&scope_expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	if (is_physical_pointer(type) && !is_physical_pointer_to_buffer_block(type))
	{
		// Need to create a magic type name which compacts the entire type information.
		auto *parent = &get_pointee_type(type);
		string name = type_to_glsl(*parent);

		uint32_t array_stride = get_decoration(type.parent_type, DecorationArrayStride);

		// Resolve all array dimensions in one go since once we lose the pointer type,
		// array information is left to to_array_type_glsl. The base type loses array information.
		while (is_array(*parent))
		{
			if (parent->array_size_literal.back())
				name += join(type.array.back(), "_");
			else
				name += join("id", type.array.back(), "_");

			name += "stride_" + std::to_string(array_stride);

			array_stride = get_decoration(parent->parent_type, DecorationArrayStride);
			parent = &get<SPIRType>(parent->parent_type);
		}

		name += "Pointer";
		return name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id);

	case SPIRType::Sampler:
		// The depth field is set by calling code based on the variable ID of the sampler, effectively reintroducing
		// this distinction into the type system.
		return comparison_ids.count(id) ? "samplerShadow" : "sampler";

	case SPIRType::AccelerationStructure:
		return ray_tracing_is_khr ? "accelerationStructureEXT" : "accelerationStructureNV";

	case SPIRType::RayQuery:
		return "rayQueryEXT";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.basetype == SPIRType::UInt && is_legacy())
	{
		if (options.es)
			// HACK: spirv-cross changes bools into uints and generates code which compares them to
			// zero. Input code will have already been validated as not to have contained any uints,
			// so any remaining uints must in fact be bools. However, simply returning "bool" here
			// will result in invalid code. Instead, return an int.
			return backend.basic_int_type;
		else
			require_extension_internal("GL_EXT_gpu_shader4");
	}

	if (type.basetype == SPIRType::AtomicCounter)
	{
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for atomic counters.");
		else if (!options.es && options.version < 420)
			require_extension_internal("GL_ARB_shader_atomic_counters");
	}

	const SPIRType *coop_type = &type;
	while (is_pointer(*coop_type) || is_array(*coop_type))
		coop_type = &get<SPIRType>(coop_type->parent_type);

	if (coop_type->op == spv::OpTypeCooperativeMatrixKHR)
	{
		require_extension_internal("GL_KHR_cooperative_matrix");
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cooperative matrix only available in Vulkan.");
		// GLSL doesn't support this as spec constant, which makes sense ...
		uint32_t use_type = get<SPIRConstant>(coop_type->cooperative.use_id).scalar();

		const char *use = nullptr;
		switch (use_type)
		{
		case CooperativeMatrixUseMatrixAKHR:
			use = "gl_MatrixUseA";
			break;

		case CooperativeMatrixUseMatrixBKHR:
			use = "gl_MatrixUseB";
			break;

		case CooperativeMatrixUseMatrixAccumulatorKHR:
			use = "gl_MatrixUseAccumulator";
			break;

		default:
			SPIRV_CROSS_THROW("Invalid matrix use.");
		}

		string scope_expr;
		if (const auto *scope = maybe_get<SPIRConstant>(coop_type->cooperative.scope_id))
		{
			if (!scope->specialization)
			{
				require_extension_internal("GL_KHR_memory_scope_semantics");
				if (scope->scalar() == spv::ScopeSubgroup)
					scope_expr = "gl_ScopeSubgroup";
				else if (scope->scalar() == spv::ScopeWorkgroup)
					scope_expr = "gl_ScopeWorkgroup";
				else
					SPIRV_CROSS_THROW("Invalid scope for cooperative matrix.");
			}
		}

		if (scope_expr.empty())
			scope_expr = to_expression(coop_type->cooperative.scope_id);

		return join("coopmat<", type_to_glsl(get<SPIRType>(coop_type->parent_type)), ", ",
		            scope_expr, ", ",
		            to_expression(coop_type->cooperative.rows_id), ", ",
		            to_expression(coop_type->cooperative.columns_id), ", ", use, ">");
	}

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::SByte:
			return backend.basic_int8_type;
		case SPIRType::UByte:
			return backend.basic_uint8_type;
		case SPIRType::Short:
			return backend.basic_int16_type;
		case SPIRType::UShort:
			return backend.basic_uint16_type;
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			return "float16_t";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			return "int64_t";
		case SPIRType::UInt64:
			return "uint64_t";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bvec", type.vecsize);
		case SPIRType::SByte:
			return join("i8vec", type.vecsize);
		case SPIRType::UByte:
			return join("u8vec", type.vecsize);
		case SPIRType::Short:
			return join("i16vec", type.vecsize);
		case SPIRType::UShort:
			return join("u16vec", type.vecsize);
		case SPIRType::Int:
			return join("ivec", type.vecsize);
		case SPIRType::UInt:
			return join("uvec", type.vecsize);
		case SPIRType::Half:
			return join("f16vec", type.vecsize);
		case SPIRType::Float:
			return join("vec", type.vecsize);
		case SPIRType::Double:
			return join("dvec", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else if (type.vecsize == type.columns) // Simple Matrix builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}